

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O2

size_t u64CTZ_fast(u64 w)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = w << 0x20;
  uVar5 = uVar4;
  if (uVar4 == 0) {
    uVar5 = w;
  }
  uVar1 = (ulong)(uVar4 == 0) * 0x20;
  uVar2 = uVar1 | 0x10;
  uVar4 = uVar5 << 0x10;
  if (uVar5 << 0x10 == 0) {
    uVar2 = uVar1 + 0x20;
    uVar4 = uVar5;
  }
  uVar1 = uVar2 - 8;
  uVar5 = uVar4 << 8;
  if (uVar4 << 8 == 0) {
    uVar1 = uVar2;
    uVar5 = uVar4;
  }
  uVar2 = uVar1 - 4;
  uVar4 = uVar5 << 4;
  if (uVar5 << 4 == 0) {
    uVar2 = uVar1;
    uVar4 = uVar5;
  }
  uVar1 = uVar4 * 4;
  uVar5 = uVar2 - 2;
  if (uVar1 == 0) {
    uVar5 = uVar2;
    uVar1 = uVar4;
  }
  lVar3 = -2;
  if ((uVar1 & 0x7fffffffffffffff) == 0) {
    lVar3 = (long)uVar1 >> 0x3f;
  }
  return lVar3 + uVar5;
}

Assistant:

size_t FAST(u64CTZ)(register u64 w)
{
	register size_t l = 64;
	register u64 t;
	if (t = w << 32)
		l -= 32, w = t;
	if (t = w << 16)
		l -= 16, w = t;
	if (t = w << 8)
		l -= 8, w = t;
	if (t = w << 4)
		l -= 4, w = t;
	if (t = w << 2)
		l -= 2, w = t;
	t = 0;
	return ((u64)(w << 1)) ? l - 2 : l - (w ? 1 : 0);
}